

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O3

void container_add_offset_test(void **state_)

{
  uint *puVar1;
  container_t **loc;
  container_t **hic;
  container_t **hic_00;
  container_t **loc_00;
  uint8_t type1;
  ushort offset;
  ushort uVar2;
  void *pvVar3;
  ushort *puVar4;
  unsigned_long a;
  array_container_t *c;
  run_container_t *run;
  long lVar5;
  _Bool _Var6;
  int32_t iVar7;
  int32_t iVar8;
  uint uVar9;
  ushort uVar10;
  uint *puVar11;
  uint8_t uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  unsigned_long uVar17;
  uint uVar18;
  unsigned_long uVar19;
  
  pvVar3 = *state_;
  puVar4 = *(ushort **)((long)pvVar3 + 8);
  a = *(unsigned_long *)((long)pvVar3 + 0x10);
  offset = *(ushort *)((long)pvVar3 + 0x18);
  type1 = *(uint8_t *)((long)pvVar3 + 0x1a);
  _assert_true((ulong)(a != 0),"test.n_values > 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
               ,0x6e);
  loc = (container_t **)((long)pvVar3 + 0x28);
  hic = (container_t **)((long)pvVar3 + 0x30);
  hic_00 = (container_t **)((long)pvVar3 + 0x40);
  loc_00 = (container_t **)((long)pvVar3 + 0x38);
  c = *(array_container_t **)((long)pvVar3 + 0x20);
  if (type1 == '\x01') {
    bitset_container_offset((bitset_container_t *)c,loc,hic,offset);
    bitset_container_offset
              (*(bitset_container_t **)((long)pvVar3 + 0x20),(container_t **)0x0,hic_00,offset);
    bitset_container_offset
              (*(bitset_container_t **)((long)pvVar3 + 0x20),loc_00,(container_t **)0x0,offset);
  }
  else if (type1 == '\x02') {
    array_container_offset(c,loc,hic,offset);
    array_container_offset
              (*(array_container_t **)((long)pvVar3 + 0x20),(container_t **)0x0,hic_00,offset);
    array_container_offset
              (*(array_container_t **)((long)pvVar3 + 0x20),loc_00,(container_t **)0x0,offset);
  }
  else {
    run_container_offset((run_container_t *)c,loc,hic,offset);
    run_container_offset
              (*(run_container_t **)((long)pvVar3 + 0x20),(container_t **)0x0,hic_00,offset);
    run_container_offset
              (*(run_container_t **)((long)pvVar3 + 0x20),loc_00,(container_t **)0x0,offset);
  }
  if ((uint)*puVar4 + (uint)offset < 0x10000) {
    _assert_true((unsigned_long)*loc,"state->lo",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x78);
    _assert_true((unsigned_long)*loc_00,"state->lo_only",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x79);
    _Var6 = container_equals(*loc,type1,*loc_00,type1);
    _assert_true((ulong)_Var6,"container_equals(state->lo, type, state->lo_only, type)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x7a);
    if (type1 == '\x03') {
      iVar7 = run_container_cardinality((run_container_t *)*loc);
    }
    else {
      iVar7 = ((run_container_t *)*loc)->n_runs;
    }
  }
  else {
    _assert_true((ulong)(*loc == (container_t *)0x0),"state->lo",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x75);
    _assert_true((ulong)(*loc_00 == (container_t *)0x0),"state->lo_only",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x76);
    iVar7 = 0;
  }
  if ((uint)puVar4[a - 1] + (uint)offset < 0x10000) {
    _assert_true((ulong)(*hic == (container_t *)0x0),"state->hi",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x7e);
    _assert_true((ulong)(*hic_00 == (container_t *)0x0),"state->hi_only",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x7f);
    iVar8 = 0;
  }
  else {
    _assert_true((unsigned_long)*hic,"state->hi",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x81);
    _assert_true((unsigned_long)*hic_00,"state->hi_only",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x82);
    _Var6 = container_equals(*hic,type1,*hic_00,type1);
    _assert_true((ulong)_Var6,"container_equals(state->hi, type, state->hi_only, type)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x83);
    run = (run_container_t *)*hic;
    if (type1 == '\x03') {
      iVar8 = run_container_cardinality(run);
    }
    else if (type1 == '\x02') {
      iVar8 = run->n_runs;
    }
    else {
      iVar8 = run->n_runs;
    }
  }
  _assert_int_equal(a,(long)(iVar8 + iVar7),
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                    ,0x87);
  uVar19 = 0;
  if (a != 0) {
LAB_00103311:
    uVar9 = (uint)puVar4[uVar19] + (uint)offset;
    if (uVar9 < 0x10000) {
      puVar11 = (uint *)*loc;
      lVar5 = *(long *)(puVar11 + 2);
      uVar10 = (ushort)uVar9;
      if (type1 == '\x03') {
        if (0 < (int)*puVar11) {
          iVar14 = *puVar11 - 1;
          uVar16 = 0;
          do {
            uVar15 = iVar14 + uVar16 >> 1;
            uVar2 = *(ushort *)(lVar5 + (ulong)uVar15 * 4);
            if (uVar2 < uVar10) {
              uVar16 = uVar15 + 1;
            }
            else {
              if (uVar2 <= uVar10) goto LAB_001033fe;
              iVar14 = uVar15 - 1;
            }
          } while ((int)uVar16 <= iVar14);
          if ((uVar16 != 0) &&
             (uVar17 = 1,
             (int)(uVar9 - *(ushort *)(lVar5 + -4 + (ulong)uVar16 * 4)) <=
             (int)(uint)*(ushort *)(lVar5 + -2 + (ulong)uVar16 * 4))) goto LAB_00103403;
        }
LAB_001033fa:
        uVar17 = 0;
      }
      else if (type1 == '\x02') {
        uVar9 = 0;
        uVar16 = *puVar11;
        do {
          iVar14 = uVar9 + 0x10;
          while( true ) {
            if ((int)uVar16 <= iVar14) {
              if ((int)uVar16 <= (int)uVar9) goto LAB_001033fa;
              uVar13 = (ulong)uVar9;
              goto LAB_001033dd;
            }
            uVar15 = (uVar16 - 1) + uVar9;
            uVar18 = uVar15 >> 1;
            uVar2 = *(ushort *)(lVar5 + (ulong)(uVar15 & 0xfffffffe));
            if (uVar10 <= uVar2) break;
            uVar9 = uVar18 + 1;
            iVar14 = uVar18 + 0x11;
          }
          uVar17 = 1;
          uVar16 = uVar18;
        } while (uVar10 < uVar2);
      }
      else {
        uVar17 = (unsigned_long)
                 ((*(ulong *)(lVar5 + (ulong)(uVar9 >> 6) * 8) >> ((ulong)uVar9 & 0x3f) & 1) != 0);
      }
      goto LAB_00103403;
    }
  }
  if (a <= uVar19) {
    return;
  }
LAB_0010343c:
  puVar11 = (uint *)*hic;
  uVar12 = type1;
  if (type1 == '\x04') {
    puVar1 = puVar11 + 2;
    puVar11 = *(uint **)puVar11;
    uVar12 = (uint8_t)*puVar1;
  }
  uVar10 = puVar4[uVar19] + offset;
  lVar5 = *(long *)(puVar11 + 2);
  if (uVar12 == '\x03') {
    if (0 < (int)*puVar11) {
      iVar14 = *puVar11 - 1;
      uVar9 = 0;
      do {
        uVar16 = iVar14 + uVar9 >> 1;
        uVar2 = *(ushort *)(lVar5 + (ulong)uVar16 * 4);
        if (uVar2 < uVar10) {
          uVar9 = uVar16 + 1;
        }
        else {
          if (uVar2 <= uVar10) goto LAB_00103541;
          iVar14 = uVar16 - 1;
        }
      } while ((int)uVar9 <= iVar14);
      if ((uVar9 != 0) &&
         (uVar17 = 1,
         (int)((uint)uVar10 - (uint)*(ushort *)(lVar5 + -4 + (ulong)uVar9 * 4)) <=
         (int)(uint)*(ushort *)(lVar5 + -2 + (ulong)uVar9 * 4))) goto LAB_00103546;
    }
LAB_0010353d:
    uVar17 = 0;
  }
  else if (uVar12 == '\x02') {
    uVar9 = 0;
    uVar16 = *puVar11;
    do {
      iVar14 = uVar9 + 0x10;
      while( true ) {
        if ((int)uVar16 <= iVar14) {
          if ((int)uVar16 <= (int)uVar9) goto LAB_0010353d;
          uVar13 = (ulong)uVar9;
          goto LAB_00103520;
        }
        uVar15 = (uVar16 - 1) + uVar9;
        uVar18 = uVar15 >> 1;
        uVar2 = *(ushort *)(lVar5 + (ulong)(uVar15 & 0xfffffffe));
        if (uVar10 <= uVar2) break;
        uVar9 = uVar18 + 1;
        iVar14 = uVar18 + 0x11;
      }
      uVar17 = 1;
      uVar16 = uVar18;
    } while (uVar10 < uVar2);
  }
  else {
    uVar17 = (unsigned_long)
             ((*(ulong *)(lVar5 + (ulong)(uVar10 >> 6) * 8) >> ((ulong)uVar10 & 0x3f) & 1) != 0);
  }
  goto LAB_00103546;
  while( true ) {
    if (uVar10 < uVar2) goto LAB_001033fa;
    uVar17 = 0;
    iVar14 = (int)uVar13;
    uVar13 = uVar13 + 1;
    if (uVar16 - 1 == iVar14) break;
LAB_001033dd:
    uVar2 = *(ushort *)(lVar5 + uVar13 * 2);
    if (uVar2 == uVar10) goto LAB_001033fe;
  }
LAB_00103403:
  _assert_true(uVar17,"container_contains(state->lo, offset + test.values[i], type)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
               ,0x8d);
  uVar19 = uVar19 + 1;
  if (uVar19 == a) {
    return;
  }
  goto LAB_00103311;
LAB_001033fe:
  uVar17 = 1;
  goto LAB_00103403;
  while( true ) {
    if (uVar10 <= uVar2 && uVar2 != uVar10) goto LAB_0010353d;
    uVar17 = 0;
    iVar14 = (int)uVar13;
    uVar13 = uVar13 + 1;
    if (uVar16 - 1 == iVar14) break;
LAB_00103520:
    uVar2 = *(ushort *)(lVar5 + uVar13 * 2);
    if (uVar2 == uVar10) goto LAB_00103541;
  }
LAB_00103546:
  _assert_true(uVar17,"container_contains(state->hi, offset + test.values[i], type)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
               ,0x91);
  uVar19 = uVar19 + 1;
  if (uVar19 == a) {
    return;
  }
  goto LAB_0010343c;
LAB_00103541:
  uVar17 = 1;
  goto LAB_00103546;
}

Assistant:

static void container_add_offset_test(void **state_) {
    container_add_offset_test_state_t *state =
        *(container_add_offset_test_state_t **)state_;
    container_add_offset_test_case_t test = state->test_case;
    uint16_t offset = test.offset;
    uint8_t type = test.type;
    int card_lo = 0, card_hi = 0;

    assert_true(test.n_values > 0);

    container_add_offset(state->in, type, &state->lo, &state->hi, offset);
    container_add_offset(state->in, type, NULL, &state->hi_only, offset);
    container_add_offset(state->in, type, &state->lo_only, NULL, offset);

    if ((int)offset + test.values[0] > UINT16_MAX) {
        assert_null(state->lo);
        assert_null(state->lo_only);
    } else {
        assert_non_null(state->lo);
        assert_non_null(state->lo_only);
        assert_true(container_equals(state->lo, type, state->lo_only, type));
        card_lo = container_get_cardinality(state->lo, type);
    }
    if ((int)offset + test.values[test.n_values - 1] <= UINT16_MAX) {
        assert_null(state->hi);
        assert_null(state->hi_only);
    } else {
        assert_non_null(state->hi);
        assert_non_null(state->hi_only);
        assert_true(container_equals(state->hi, type, state->hi_only, type));
        card_hi = container_get_cardinality(state->hi, type);
    }

    assert_int_equal(test.n_values, card_lo + card_hi);

    size_t i = 0;
    for (; i < test.n_values && (int)offset + test.values[i] <= UINT16_MAX;
         i++) {
        assert_true(
            container_contains(state->lo, offset + test.values[i], type));
    }
    for (; i < test.n_values; i++) {
        assert_true(
            container_contains(state->hi, offset + test.values[i], type));
    }
}